

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserParserTemplateBase.cpp
# Opt level: O1

bool __thiscall
GeneratedSaxParser::ParserTemplateBase::handleError
          (ParserTemplateBase *this,Severity severity,ErrorType errorType,StringHash attributeHash,
          ParserChar *additionalText)

{
  bool bVar1;
  _Elt_pointer pEVar2;
  char *attribute;
  StringHash elementHash;
  StringHash local_30;
  
  pEVar2 = (this->mElementDataStack).
           super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pEVar2 == (this->mElementDataStack).
                super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    elementHash = 0;
  }
  else {
    if (pEVar2 == (this->mElementDataStack).
                  super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pEVar2 = (this->mElementDataStack).
               super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
    }
    elementHash = pEVar2[-1].elementHash;
  }
  local_30 = attributeHash;
  attribute = getNameByStringHash(this,&local_30);
  bVar1 = handleError(this,severity,errorType,elementHash,attribute,additionalText);
  return bVar1;
}

Assistant:

bool ParserTemplateBase::handleError( ParserError::Severity severity,
												 ParserError::ErrorType errorType,
												 StringHash attributeHash,
												 const ParserChar* additionalText )
	{
		StringHash elementHash = mElementDataStack.empty() ? 0 : mElementDataStack.back().elementHash;

		return handleError(severity,
			errorType,
			elementHash,
			attributeHash,
			additionalText);
	}